

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O1

void __thiscall antlr::BitSet::BitSet(BitSet *this,uint nbits)

{
  ulong *puVar1;
  long lVar2;
  byte bVar3;
  difference_type __n;
  ulong uVar4;
  allocator_type local_1a;
  bool local_19;
  
  local_19 = false;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->storage,(ulong)nbits,&local_19,&local_1a);
  if (nbits != 0) {
    lVar2 = (long)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar4 = 0;
    do {
      bVar3 = (byte)uVar4 & 0x3f;
      puVar1 = (ulong *)(lVar2 + (uVar4 >> 6) * 8);
      *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      uVar4 = uVar4 + 1;
    } while (nbits != uVar4);
  }
  return;
}

Assistant:

BitSet::BitSet(unsigned int nbits)
: storage(nbits)
{
	for (unsigned int i = 0; i < nbits ; i++ )
		storage[i] = false;
}